

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.cc
# Opt level: O0

pair<Elf64_Sym,_unsigned_long> * __thiscall
pstack::Elf::Object::findDynamicSymbol
          (pair<Elf64_Sym,_unsigned_long> *__return_storage_ptr__,Object *this,string *name)

{
  GnuHash *pGVar1;
  SymHash *pSVar2;
  Sym *pSVar3;
  int local_74;
  tuple<unsigned_int&,Elf64_Sym&> local_70 [20];
  uint local_5c;
  pair<unsigned_int,_Elf64_Sym> local_58;
  undefined1 local_34 [8];
  uint32_t idx;
  Sym sym;
  string *name_local;
  Object *this_local;
  
  sym.st_size = (Elf64_Xword)name;
  pGVar1 = gnu_hash(this);
  if (pGVar1 == (GnuHash *)0x0) {
    pSVar2 = hash(this);
    if (pSVar2 == (SymHash *)0x0) {
      local_5c = 0;
      pSVar3 = undef();
      std::make_pair<unsigned_int,Elf64_Sym_const&>(&local_58,&local_5c,pSVar3);
    }
    else {
      pSVar2 = hash(this);
      SymHash::findSymbol(&local_58,pSVar2,(string *)sym.st_size);
    }
  }
  else {
    pGVar1 = gnu_hash(this);
    GnuHash::findSymbol(&local_58,pGVar1,(string *)sym.st_size);
  }
  std::tie<unsigned_int,Elf64_Sym>((uint *)local_70,(value_type *)local_34);
  std::tuple<unsigned_int&,Elf64_Sym&>::operator=(local_70,&local_58);
  if (local_34._0_4_ == 0) {
    pSVar3 = undef();
    local_74 = 0;
    std::pair<Elf64_Sym,_unsigned_long>::pair<int,_true>(__return_storage_ptr__,pSVar3,&local_74);
  }
  else {
    std::pair<Elf64_Sym,_unsigned_long>::pair<Elf64_Sym_&,_unsigned_int_&,_true>
              (__return_storage_ptr__,(value_type *)(local_34 + 4),(uint *)local_34);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<Sym, size_t>
Object::findDynamicSymbol(const std::string &name)
{
    Sym sym;
    uint32_t idx;

    std::tie(idx, sym) = gnu_hash() ? gnu_hash()->findSymbol(name)
             : hash() ? hash()->findSymbol(name)
             : std::make_pair(uint32_t(0), undef());

    if (idx == 0)
        return { undef() , 0 };

    // We found a symbol in our hash table. Find its version if we can.
    return {sym, idx};
}